

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QListModeViewBase::updateVerticalScrollBar(QListModeViewBase *this,QSize *step)

{
  Flow FVar1;
  QListViewPrivate *pQVar2;
  QWidgetData *pQVar3;
  ScrollMode SVar4;
  int step_00;
  QScrollBar *pQVar5;
  QList<int> *pQVar6;
  int iVar7;
  
  SVar4 = QAbstractItemView::verticalScrollMode
                    ((QAbstractItemView *)(this->super_QCommonListViewBase).qq);
  if (SVar4 == ScrollPerItem) {
    pQVar2 = (this->super_QCommonListViewBase).dd;
    FVar1 = pQVar2->flow;
    if (((FVar1 == TopToBottom) && (pQVar2->wrap != true)) ||
       ((FVar1 == LeftToRight && (pQVar2->wrap == true)))) {
      pQVar6 = &this->segmentPositions;
      if (FVar1 == TopToBottom) {
        pQVar6 = &this->scrollValueMap;
      }
      iVar7 = (int)(pQVar6->d).size + -1;
      if (iVar7 < 1) {
        pQVar5 = QAbstractScrollArea::verticalScrollBar
                           ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
        iVar7 = 0;
      }
      else {
        pQVar3 = ((pQVar2->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport
                 )->data;
        step_00 = perItemScrollingPageSteps
                            (this,((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1,
                             (this->super_QCommonListViewBase).contentsSize.ht.m_i,pQVar2->wrap);
        pQVar5 = QAbstractScrollArea::verticalScrollBar
                           ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
        QAbstractSlider::setSingleStep(&pQVar5->super_QAbstractSlider,1);
        pQVar5 = QAbstractScrollArea::verticalScrollBar
                           ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
        QAbstractSlider::setPageStep(&pQVar5->super_QAbstractSlider,step_00);
        pQVar5 = QAbstractScrollArea::verticalScrollBar
                           ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
        iVar7 = iVar7 - step_00;
      }
      QAbstractSlider::setRange(&pQVar5->super_QAbstractSlider,0,iVar7);
      return;
    }
  }
  QCommonListViewBase::updateVerticalScrollBar(&this->super_QCommonListViewBase,step);
  return;
}

Assistant:

void QListModeViewBase::updateVerticalScrollBar(const QSize &step)
{
    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem
        && ((flow() == QListView::TopToBottom && !isWrapping())
        || (flow() == QListView::LeftToRight && isWrapping()))) {
            const int steps = (flow() == QListView::TopToBottom ? scrollValueMap : segmentPositions).size() - 1;
            if (steps > 0) {
                const int pageSteps = perItemScrollingPageSteps(viewport()->height(), contentsSize.height(), isWrapping());
                verticalScrollBar()->setSingleStep(1);
                verticalScrollBar()->setPageStep(pageSteps);
                verticalScrollBar()->setRange(0, steps - pageSteps);
            } else {
                verticalScrollBar()->setRange(0, 0);
            }
            // } else if (vertical && d->isWrapping() && d->movement == Static) {
            // ### wrapped scrolling in flow direction
    } else {
        QCommonListViewBase::updateVerticalScrollBar(step);
    }
}